

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O3

void __thiscall
notch::io::PlainTextNetworkReader::read_layer
          (PlainTextNetworkReader *this,istream *in,MakeNet *mknet)

{
  int iVar1;
  runtime_error *prVar2;
  Activation *pAVar3;
  LayerType lt;
  Array b;
  Array w;
  string tag;
  string activationTag;
  size_t outputDim;
  size_t inputDim;
  string local_c0;
  Array local_a0;
  Array local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  size_t local_40 [2];
  
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_40[1] = 0;
  local_40[0] = 0;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
  local_90._M_size = 0;
  local_90._M_data = (float *)operator_new(0);
  local_a0._M_size = 0;
  local_a0._M_data = (float *)operator_new(0);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"layer:","");
  read_tag_value<std::__cxx11::string>(this,in,&local_c0,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  read_layer_config(this,in,local_40 + 1,local_40,&local_60,&local_90,&local_a0);
  iVar1 = std::__cxx11::string::compare((char *)&local_80);
  if (iVar1 == 0) {
    pAVar3 = getActivation(this,&local_60);
    if (pAVar3 == (Activation *)0x0) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                     "unsupported activation: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60)
      ;
      std::runtime_error::runtime_error(prVar2,(string *)&local_c0);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    core::MakeNet::addFC(mknet,&local_90,&local_a0,pAVar3);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&local_80);
    if (iVar1 == 0) {
      pAVar3 = getActivation(this,&local_60);
      if (pAVar3 == (Activation *)0x0) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_c0,"unsupported activation: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_60);
        std::runtime_error::runtime_error(prVar2,(string *)&local_c0);
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      core::MakeNet::addActivation(mknet,pAVar3);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)&local_80);
      if (iVar1 == 0) {
        lt = L2Loss;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)&local_80);
        if (iVar1 == 0) {
          lt = Hinge;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)&local_80);
          lt = Softmax;
          if (iVar1 != 0) {
            prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_c0,"unsupported layer type: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_80);
            std::runtime_error::runtime_error(prVar2,(string *)&local_c0);
            __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
      }
      core::MakeNet::addLoss(mknet,lt);
    }
  }
  operator_delete(local_a0._M_data);
  operator_delete(local_90._M_data);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  return;
}

Assistant:

void read_layer(std::istream &in, MakeNet &mknet) {
        std::string tag;
        size_t inputDim = 0;
        size_t outputDim = 0;
        std::string activationTag = "";
        Array w(0);
        Array b(0);
        read_tag_value<std::string>(in, "layer:", tag);
        read_layer_config(in, inputDim, outputDim, activationTag, w, b);
        if (tag == "FullyConnectedLayer") {
            auto afptr = getActivation(activationTag);
            if (afptr) {
                mknet.addFC(w, b, *afptr);
            } else {
                throw std::runtime_error("unsupported activation: " +activationTag);
            }
        } else if (tag == "ActivationLayer") {
            auto afptr = getActivation(activationTag);
            if (afptr) {
                mknet.addActivation(*afptr);
            } else {
                throw std::runtime_error("unsupported activation: " +activationTag);
            }
        } else if (tag == "EuclideanLoss") {
            mknet.addL2Loss();
        } else if (tag == "HingeLoss") {
            mknet.addHingeLoss();
        } else if (tag == "SoftmaxWithLoss") {
            mknet.addSoftmax();
        } else {
            throw std::runtime_error("unsupported layer type: " + tag);
        }
    }